

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O2

OPJ_BOOL opj_jp2_end_decompress(opj_jp2_t *jp2,opj_stream_private_t *cio,opj_event_mgr_t *p_manager)

{
  OPJ_BOOL OVar1;
  
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x83d,
                  "OPJ_BOOL opj_jp2_end_decompress(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (cio != (opj_stream_private_t *)0x0) {
    if (p_manager == (opj_event_mgr_t *)0x0) {
      __assert_fail("p_manager != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                    ,0x83f,
                    "OPJ_BOOL opj_jp2_end_decompress(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                   );
    }
    OVar1 = opj_procedure_list_add_procedure
                      (jp2->m_procedure_list,opj_jp2_read_header_procedure,p_manager);
    if (OVar1 != 0) {
      OVar1 = opj_jp2_exec(jp2,jp2->m_procedure_list,cio,p_manager);
      if (OVar1 != 0) {
        OVar1 = opj_j2k_end_decompress(jp2->j2k,cio,p_manager);
        return OVar1;
      }
    }
    return 0;
  }
  __assert_fail("cio != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                ,0x83e,
                "OPJ_BOOL opj_jp2_end_decompress(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
               );
}

Assistant:

OPJ_BOOL opj_jp2_end_decompress(opj_jp2_t *jp2,
                                opj_stream_private_t *cio,
                                opj_event_mgr_t * p_manager
                               )
{
    /* preconditions */
    assert(jp2 != 00);
    assert(cio != 00);
    assert(p_manager != 00);

    /* customization of the end encoding */
    if (! opj_jp2_setup_end_header_reading(jp2, p_manager)) {
        return OPJ_FALSE;
    }

    /* write header */
    if (! opj_jp2_exec(jp2, jp2->m_procedure_list, cio, p_manager)) {
        return OPJ_FALSE;
    }

    return opj_j2k_end_decompress(jp2->j2k, cio, p_manager);
}